

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  byte bVar1;
  uint uVar2;
  const_reference ppcVar3;
  char *pcVar4;
  cmSystemTools *pcVar5;
  ulong uVar6;
  ostream *poVar7;
  char *in_RCX;
  bool local_36a;
  bool local_369;
  undefined1 local_328 [8];
  MapSourceFileFlags sourceFileFlags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string *local_2b0;
  string *outputRelativeToSourceRoot;
  string *local_288;
  string *sourceRootRelativeToOutput;
  undefined1 local_270 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  fout._576_8_ = cmLocalGenerator::GetMakefile(*ppcVar3);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_270,pcVar4,false);
  bVar1 = std::ios::operator!((ios *)(local_270 + (long)*(_func_int **)((long)local_270 + -0x18)));
  if ((bVar1 & 1) == 0) {
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar5 = (cmSystemTools *)cmLocalGenerator::GetBinaryDirectory(*ppcVar3);
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar4 = cmLocalGenerator::GetSourceDirectory(*ppcVar3);
    cmSystemTools::RelativePath_abi_cxx11_
              ((string *)&outputRelativeToSourceRoot,pcVar5,pcVar4,in_RCX);
    local_288 = (string *)&outputRelativeToSourceRoot;
    std::operator<<((ostream *)local_270,"{\n");
    std::operator<<((ostream *)local_270,"\t\"folders\":\n\t[\n\t");
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)local_270,"\t{\n\t\t\t\"path\": \"");
      poVar7 = std::operator<<(poVar7,local_288);
      std::operator<<(poVar7,"\"");
      ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (lgs,0);
      pcVar5 = (cmSystemTools *)cmLocalGenerator::GetSourceDirectory(*ppcVar3);
      ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (lgs,0);
      pcVar4 = cmLocalGenerator::GetBinaryDirectory(*ppcVar3);
      cmSystemTools::RelativePath_abi_cxx11_(&local_2d0,pcVar5,pcVar4,in_RCX);
      local_2b0 = &local_2d0;
      uVar2 = std::__cxx11::string::empty();
      sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      local_369 = false;
      if ((uVar2 & 1) == 0) {
        uVar6 = std::__cxx11::string::length();
        local_36a = true;
        if (2 < uVar6) {
          std::__cxx11::string::substr((ulong)&local_2f0,(ulong)local_2b0);
          sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
          local_36a = std::operator!=(&local_2f0,"../");
        }
        local_369 = local_36a;
      }
      if ((sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      if (local_369 != false) {
        poVar7 = std::operator<<((ostream *)local_270,",\n\t\t\t\"folder_exclude_patterns\": [\"");
        poVar7 = std::operator<<(poVar7,(string *)local_2b0);
        std::operator<<(poVar7,"\"]");
      }
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    else {
      std::operator<<((ostream *)local_270,"\t{\n\t\t\t\"path\": \"./\"");
    }
    std::operator<<((ostream *)local_270,"\n\t\t}");
    std::operator<<((ostream *)local_270,"\n\t]");
    std::operator<<((ostream *)local_270,",\n\t\"build_systems\":\n\t[\n\t");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)local_328);
    AppendAllTargets(this,lgs,(cmMakefile *)fout._576_8_,(cmGeneratedFileStream *)local_270,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)local_328);
    std::operator<<((ostream *)local_270,"\n\t]");
    std::operator<<((ostream *)local_270,"\n\t}");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)local_328);
    std::__cxx11::string::~string((string *)&outputRelativeToSourceRoot);
    sourceRootRelativeToOutput._0_4_ = 0;
  }
  else {
    sourceRootRelativeToOutput._0_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  const std::string &sourceRootRelativeToOutput = cmSystemTools::RelativePath(
                     lgs[0]->GetBinaryDirectory(),
                     lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty())
    {
      fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
      const std::string &outputRelativeToSourceRoot =
        cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                    lgs[0]->GetBinaryDirectory());
      if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
          (outputRelativeToSourceRoot.substr(0, 3) != "../")))
        {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\"" <<
                outputRelativeToSourceRoot << "\"]";
        }
    }
  else
    {
      fout << "\t{\n\t\t\t\"path\": \"./\"";
    }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  fout << "\n\t}";
}